

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O3

CURLcode rtsp_rtp_write_resp(Curl_easy *data,char *buf,size_t blen,_Bool is_eos)

{
  byte *pbVar1;
  undefined1 *puVar2;
  connectdata *pcVar3;
  CURLcode CVar4;
  byte bVar5;
  size_t consumed;
  size_t local_38;
  
  pcVar3 = data->conn;
  local_38 = 0;
  if (((data->req).field_0xd9 & 1) == 0) {
    pbVar1 = (byte *)((long)&pcVar3->proto + 0x34);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  CVar4 = CURLE_OK;
  if (blen != 0) {
    if ((*(byte *)((long)&pcVar3->proto + 0x34) & 1) == 0) {
      CVar4 = rtsp_filter_rtp(data,buf,blen,&local_38);
      if (CVar4 != CURLE_OK) goto LAB_0014b1c2;
      buf = buf + local_38;
      blen = blen - local_38;
    }
    if ((blen != 0 & (data->req).field_0xd9) == 1) {
      pbVar1 = (byte *)((long)&pcVar3->proto + 0x34);
      *pbVar1 = *pbVar1 | 1;
      CVar4 = Curl_http_write_resp_hds(data,buf,blen,&local_38);
      if (CVar4 != CURLE_OK) goto LAB_0014b1c2;
      bVar5 = *(byte *)((long)&pcVar3->proto + 0x34);
      if (((data->req).field_0xd9 & 1) == 0) {
        bVar5 = bVar5 & 0xfe;
        *(byte *)((long)&pcVar3->proto + 0x34) = bVar5;
      }
      buf = buf + local_38;
      blen = blen - local_38;
      if ((bVar5 & 1) == 0) {
        if ((data->req).size < 0) {
          (data->req).size = 0;
          puVar2 = &(data->req).field_0xd9;
          *puVar2 = *puVar2 | 8;
        }
        CVar4 = rtsp_filter_rtp(data,buf,blen,&local_38);
        if (CVar4 != CURLE_OK) goto LAB_0014b1c2;
        blen = blen - local_38;
      }
    }
    if ((pcVar3->proto).rtspc.state != RTP_PARSE_SKIP) {
      puVar2 = &(data->req).field_0xd9;
      *puVar2 = *puVar2 & 0xfd;
    }
    if ((is_eos) || (CVar4 = CURLE_OK, blen != 0)) {
      CVar4 = Curl_client_write(data,(uint)is_eos * 0x80 + 1,buf,blen);
    }
  }
LAB_0014b1c2:
  if (((data->set).rtspreq == RTSPREQ_RECEIVE) && ((pcVar3->proto).rtspc.state == RTP_PARSE_SKIP)) {
    puVar2 = &(data->req).field_0xd9;
    *puVar2 = *puVar2 | 8;
  }
  return CVar4;
}

Assistant:

static CURLcode rtsp_rtp_write_resp(struct Curl_easy *data,
                                    const char *buf,
                                    size_t blen,
                                    bool is_eos)
{
  struct rtsp_conn *rtspc = &(data->conn->proto.rtspc);
  CURLcode result = CURLE_OK;
  size_t consumed = 0;

  if(!data->req.header)
    rtspc->in_header = FALSE;
  if(!blen) {
    goto out;
  }

  DEBUGF(infof(data, "rtsp_rtp_write_resp(len=%zu, in_header=%d, eos=%d)",
               blen, rtspc->in_header, is_eos));

  /* If header parsing is not ongoing, extract RTP messages */
  if(!rtspc->in_header) {
    result = rtsp_filter_rtp(data, buf, blen, &consumed);
    if(result)
      goto out;
    buf += consumed;
    blen -= consumed;
    /* either we consumed all or are at the start of header parsing */
    if(blen && !data->req.header)
      DEBUGF(infof(data, "RTSP: %zu bytes, possibly excess in response body",
                   blen));
  }

  /* we want to parse headers, do so */
  if(data->req.header && blen) {
    rtspc->in_header = TRUE;
    result = Curl_http_write_resp_hds(data, buf, blen, &consumed);
    if(result)
      goto out;

    buf += consumed;
    blen -= consumed;

    if(!data->req.header)
      rtspc->in_header = FALSE;

    if(!rtspc->in_header) {
      /* If header parsing is done, extract interleaved RTP messages */
      if(data->req.size <= -1) {
        /* Respect section 4.4 of rfc2326: If the Content-Length header is
           absent, a length 0 must be assumed. */
        data->req.size = 0;
        data->req.download_done = TRUE;
      }
      result = rtsp_filter_rtp(data, buf, blen, &consumed);
      if(result)
        goto out;
      blen -= consumed;
    }
  }

  if(rtspc->state != RTP_PARSE_SKIP)
    data->req.done = FALSE;
  /* we SHOULD have consumed all bytes, unless the response is borked.
   * In which case we write out the left over bytes, letting the client
   * writer deal with it (it will report EXCESS and fail the transfer). */
  DEBUGF(infof(data, "rtsp_rtp_write_resp(len=%zu, in_header=%d, done=%d "
               " rtspc->state=%d, req.size=%" FMT_OFF_T ")",
               blen, rtspc->in_header, data->req.done, rtspc->state,
               data->req.size));
  if(!result && (is_eos || blen)) {
    result = Curl_client_write(data, CLIENTWRITE_BODY|
                               (is_eos? CLIENTWRITE_EOS:0),
                               (char *)buf, blen);
  }

out:
  if((data->set.rtspreq == RTSPREQ_RECEIVE) &&
     (rtspc->state == RTP_PARSE_SKIP)) {
    /* In special mode RECEIVE, we just process one chunk of network
     * data, so we stop the transfer here, if we have no incomplete
     * RTP message pending. */
    data->req.download_done = TRUE;
  }
  return result;
}